

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_argv.cpp
# Opt level: O2

void __thiscall DArgs::RemoveArgs(DArgs *this,char *check)

{
  char cVar1;
  uint index;
  
  index = CheckParm(this,check,1);
  if ((0 < (int)index) && ((int)index < (int)((this->Argv).Count - 1))) {
    do {
      TArray<FString,_FString>::Delete(&this->Argv,index);
      cVar1 = *(this->Argv).Array[index].Chars;
      if (cVar1 == '+') {
        return;
      }
      if (cVar1 == '-') {
        return;
      }
    } while ((int)index < (int)((this->Argv).Count - 1));
  }
  return;
}

Assistant:

void DArgs::RemoveArgs(const char *check)
{
	int i = CheckParm(check);

	if (i > 0 && i < (int)Argv.Size() - 1)
	{
		do 
		{
			RemoveArg(i);
		}
		while (Argv[i][0] != '+' && Argv[i][0] != '-' && i < (int)Argv.Size() - 1);
	}
}